

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O0

Node * __thiscall
mapbox::detail::Earcut<unsigned_int>::insertNode<std::array<float,2ul>>
          (Earcut<unsigned_int> *this,size_t i,array<float,_2UL> *pt,Node *last)

{
  Node *pNVar1;
  Node *in_RCX;
  undefined4 in_ESI;
  type tVar2;
  type tVar3;
  Node *p;
  undefined4 in_stack_ffffffffffffffc8;
  uint *in_stack_ffffffffffffffd8;
  
  tVar2 = util::nth<0UL,_std::array<float,_2UL>_>::get((array<float,_2UL> *)0x199ff9);
  tVar3 = util::nth<1UL,_std::array<float,_2UL>_>::get((array<float,_2UL> *)0x19a009);
  pNVar1 = ObjectPool<mapbox::detail::Earcut<unsigned_int>::Node,std::allocator<mapbox::detail::Earcut<unsigned_int>::Node>>
           ::construct<unsigned_int,float,float>
                     ((ObjectPool<mapbox::detail::Earcut<unsigned_int>::Node,_std::allocator<mapbox::detail::Earcut<unsigned_int>::Node>_>
                       *)in_RCX,in_stack_ffffffffffffffd8,(float *)CONCAT44(in_ESI,tVar2),
                      (float *)CONCAT44(tVar3,in_stack_ffffffffffffffc8));
  if (in_RCX == (Node *)0x0) {
    pNVar1->prev = pNVar1;
    pNVar1->next = pNVar1;
  }
  else {
    pNVar1->next = in_RCX->next;
    pNVar1->prev = in_RCX;
    in_RCX->next->prev = pNVar1;
    in_RCX->next = pNVar1;
  }
  return pNVar1;
}

Assistant:

typename Earcut<N>::Node*
Earcut<N>::insertNode(std::size_t i, const Point& pt, Node* last) {
    Node* p = nodes.construct(static_cast<N>(i), util::nth<0, Point>::get(pt), util::nth<1, Point>::get(pt));

    if (!last) {
        p->prev = p;
        p->next = p;

    } else {
        assert(last);
        p->next = last->next;
        p->prev = last;
        last->next->prev = p;
        last->next = p;
    }
    return p;
}